

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

field_t * SEM_DecList(ast *node,attr *a,int ins)

{
  ast *paVar1;
  field_t *pfVar2;
  field_t *pfVar3;
  undefined4 in_EDX;
  ast *in_RSI;
  ast *in_RDI;
  field_t *f;
  ast *child3;
  undefined4 in_stack_ffffffffffffffe8;
  
  paVar1 = child(in_RDI,3);
  child(in_RDI,1);
  pfVar2 = SEM_Dec((ast *)f,(attr *)in_RDI,(int)((ulong)in_RSI >> 0x20));
  if (paVar1 != (ast *)0x0) {
    pfVar3 = SEM_DecList(in_RSI,(attr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                         (int)((ulong)paVar1 >> 0x20));
    pfVar2->next = pfVar3;
  }
  return pfVar2;
}

Assistant:

static struct field_t* SEM_DecList(struct ast *node, struct attr *a, int ins) {
    struct ast *child3 = child(node, 3);
    struct field_t *f = SEM_Dec(child(node, 1), a, ins);
    if (child3)
        f->next = SEM_DecList(child3, a, ins);
    return f;
}